

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O1

void __thiscall leveldb::DBTest_MultiThreaded_Test::TestBody(DBTest_MultiThreaded_Test *this)

{
  byte *pbVar1;
  int iVar2;
  SpecialEnv *pSVar3;
  long lVar4;
  Env *pEVar5;
  int id;
  undefined8 *puVar6;
  MTState mt;
  MTThread thread [4];
  DBTest_MultiThreaded_Test *local_98;
  undefined1 local_90;
  undefined4 auStack_8c [4];
  byte abStack_7c [4];
  undefined8 local_78;
  undefined4 local_70 [16];
  
  while( true ) {
    local_90 = 0;
    lVar4 = -4;
    do {
      pbVar1 = abStack_7c + lVar4 * 4;
      pbVar1[0] = 0;
      pbVar1[1] = 0;
      pbVar1[2] = 0;
      pbVar1[3] = 0;
      *(undefined1 *)((long)local_70 + lVar4 + -8) = 0;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0);
    lVar4 = 0;
    puVar6 = &local_78;
    local_98 = this;
    do {
      *puVar6 = &local_98;
      *(int *)(puVar6 + 1) = (int)lVar4;
      pSVar3 = (this->super_DBTest).env_;
      (*(pSVar3->super_EnvWrapper).super_Env._vptr_Env[0x12])
                (pSVar3,anon_unknown_4::MTThreadBody,puVar6);
      lVar4 = lVar4 + 1;
      puVar6 = puVar6 + 2;
    } while (lVar4 != 4);
    pEVar5 = Env::Default();
    (*pEVar5->_vptr_Env[0x16])(pEVar5);
    local_90 = 1;
    lVar4 = 0;
    do {
      while ((abStack_7c[lVar4] & 1) == 0) {
        pEVar5 = Env::Default();
        (*pEVar5->_vptr_Env[0x16])(pEVar5);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    iVar2 = (this->super_DBTest).option_config_;
    (this->super_DBTest).option_config_ = iVar2 + 1;
    if (2 < iVar2) break;
    DBTest::DestroyAndReopen(&this->super_DBTest,(Options *)0x0);
  }
  return;
}

Assistant:

TEST_F(DBTest, MultiThreaded) {
  do {
    // Initialize state
    MTState mt;
    mt.test = this;
    mt.stop.store(false, std::memory_order_release);
    for (int id = 0; id < kNumThreads; id++) {
      mt.counter[id].store(false, std::memory_order_release);
      mt.thread_done[id].store(false, std::memory_order_release);
    }

    // Start threads
    MTThread thread[kNumThreads];
    for (int id = 0; id < kNumThreads; id++) {
      thread[id].state = &mt;
      thread[id].id = id;
      env_->StartThread(MTThreadBody, &thread[id]);
    }

    // Let them run for a while
    DelayMilliseconds(kTestSeconds * 1000);

    // Stop the threads and wait for them to finish
    mt.stop.store(true, std::memory_order_release);
    for (int id = 0; id < kNumThreads; id++) {
      while (!mt.thread_done[id].load(std::memory_order_acquire)) {
        DelayMilliseconds(100);
      }
    }
  } while (ChangeOptions());
}